

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  Scope result_id;
  Scope result_type_00;
  bool bVar1;
  CompilerError *pCVar2;
  allocator local_469;
  string local_468 [38];
  undefined1 local_442;
  allocator local_441;
  string local_440 [32];
  uint32_t local_420;
  undefined1 local_41a;
  allocator local_419;
  uint32_t direction;
  Scope local_3f8;
  undefined1 local_3f2;
  allocator local_3f1;
  GroupOperation operation_15;
  Scope local_3d0;
  undefined1 local_3ca;
  allocator local_3c9;
  GroupOperation operation_14;
  Scope local_3a8;
  undefined1 local_3a2;
  allocator local_3a1;
  GroupOperation operation_13;
  Scope local_380;
  undefined1 local_37a;
  allocator local_379;
  GroupOperation operation_12;
  Scope local_358;
  undefined1 local_352;
  allocator local_351;
  GroupOperation operation_11;
  Scope local_330;
  undefined1 local_32a;
  allocator local_329;
  GroupOperation operation_10;
  Scope local_308;
  undefined1 local_302;
  allocator local_301;
  GroupOperation operation_9;
  Scope local_2e0;
  undefined1 local_2da;
  allocator local_2d9;
  GroupOperation operation_8;
  Scope local_2b8;
  undefined1 local_2b2;
  allocator local_2b1;
  GroupOperation operation_7;
  Scope local_290;
  undefined1 local_28a;
  allocator local_289;
  GroupOperation operation_6;
  Scope local_268;
  undefined1 local_262;
  allocator local_261;
  GroupOperation operation_5;
  Scope local_240;
  undefined1 local_23a;
  allocator local_239;
  GroupOperation operation_4;
  Scope local_218;
  undefined1 local_212;
  allocator local_211;
  GroupOperation operation_3;
  Scope local_1f0;
  allocator local_1e9;
  GroupOperation operation_2;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  uint32_t local_1a0;
  Scope local_19c;
  Scope scope;
  uint32_t id;
  uint32_t result_type;
  allocator local_169;
  string local_168 [38];
  undefined1 local_142;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [36];
  Scope local_cc;
  SPIRType *pSStack_c8;
  GroupOperation operation_1;
  SPIRType *type;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  Scope local_70;
  BaseType local_6c;
  GroupOperation operation;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  allocator local_49;
  string local_48 [36];
  Op local_24;
  Scope *pSStack_20;
  Op op;
  uint32_t *ops;
  Instruction *i_local;
  CompilerGLSL *this_local;
  
  ops = (uint32_t *)i;
  i_local = (Instruction *)this;
  pSStack_20 = Compiler::stream(&this->super_Compiler,i);
  local_24 = (Op)(ushort)*ops;
  if ((((this->options).vulkan_semantics & 1U) == 0) &&
     (bVar1 = is_supported_subgroup_op_in_opengl(local_24), !bVar1)) {
    int_type._3_1_ = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"This subgroup operation is only supported in Vulkan semantics.",&local_49);
    CompilerError::CompilerError(pCVar2,(string *)local_48);
    int_type._3_1_ = Unknown >> 0x18;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uint_type = get_integer_width_for_instruction(this,(Instruction *)ops);
  operation = to_signed_basetype(uint_type);
  local_6c = to_unsigned_basetype(uint_type);
  switch(local_24) {
  case OpGroupNonUniformElect:
    request_subgroup_feature(this,SubgroupElect);
    break;
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
  case OpGroupNonUniformAllEqual:
    pSStack_c8 = Compiler::expression_type(&this->super_Compiler,pSStack_20[3]);
    if ((*(int *)&(pSStack_c8->super_IVariant).field_0xc == 2) && (pSStack_c8->vecsize == 1)) {
      request_subgroup_feature(this,SubgroupAll_Any_AllEqualBool);
    }
    else {
      request_subgroup_feature(this,SubgroupAllEqualT);
    }
    break;
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformBroadcastFirst:
    request_subgroup_feature(this,SubgroupBrodcast_First);
    break;
  case OpGroupNonUniformBallot:
    request_subgroup_feature(this,SubgroupBallot);
    break;
  case OpGroupNonUniformInverseBallot:
    request_subgroup_feature(this,SubgroupInverseBallot_InclBitCount_ExclBitCout);
    break;
  case OpGroupNonUniformBallotBitExtract:
    request_subgroup_feature(this,SubgroupBallotBitExtract);
    break;
  case OpGroupNonUniformBallotBitCount:
    local_70 = pSStack_20[3];
    if (local_70 == ScopeCrossDevice) {
      request_subgroup_feature(this,SubgroupBallotBitCount);
    }
    else if ((local_70 == ScopeDevice) || (local_70 == ScopeWorkgroup)) {
      request_subgroup_feature(this,SubgroupInverseBallot_InclBitCount_ExclBitCout);
    }
    break;
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
    request_subgroup_feature(this,SubgroupBallotFindLSB_MSB);
    break;
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"GL_KHR_shader_subgroup_shuffle",&local_91);
    require_extension_internal(this,(string *)local_90);
    ::std::__cxx11::string::~string(local_90);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
    break;
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_b8,"GL_KHR_shader_subgroup_shuffle_relative",(allocator *)((long)&type + 7));
    require_extension_internal(this,(string *)local_b8);
    ::std::__cxx11::string::~string(local_b8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
    break;
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
    local_cc = pSStack_20[3];
    if (local_cc == ScopeSubgroup) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f0,"GL_KHR_shader_subgroup_clustered",&local_f1);
      require_extension_internal(this,(string *)local_f0);
      ::std::__cxx11::string::~string(local_f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    else {
      if (((local_cc != ScopeWorkgroup) && (local_cc != ScopeDevice)) &&
         (local_cc != ScopeCrossDevice)) {
        local_142 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_140,"Invalid group operation.",&local_141);
        CompilerError::CompilerError(pCVar2,(string *)local_140);
        local_142 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"GL_KHR_shader_subgroup_arithmetic",&local_119);
      require_extension_internal(this,(string *)local_118);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    break;
  default:
    id._2_1_ = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&result_type,"Invalid opcode for subgroup.",(allocator *)((long)&id + 3));
    CompilerError::CompilerError(pCVar2,(string *)&result_type);
    id._2_1_ = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_168,"GL_KHR_shader_subgroup_quad",&local_169);
    require_extension_internal(this,(string *)local_168);
    ::std::__cxx11::string::~string(local_168);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  scope = *pSStack_20;
  local_19c = pSStack_20[1];
  local_1a0 = Compiler::evaluate_constant_u32(&this->super_Compiler,pSStack_20[2]);
  result_type_00 = scope;
  result_id = local_19c;
  if (local_1a0 != 3) {
    local_1c2 = 1;
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1c0,"Only subgroup scope is supported.",&local_1c1);
    CompilerError::CompilerError(pCVar2,(string *)local_1c0);
    local_1c2 = 0;
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(local_24) {
  case OpGroupNonUniformElect:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&operation_2,"subgroupElect()",&local_1e9);
    emit_op(this,result_type_00,result_id,(string *)&operation_2,true,false);
    ::std::__cxx11::string::~string((string *)&operation_2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    break;
  case OpGroupNonUniformAll:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupAll");
    break;
  case OpGroupNonUniformAny:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupAny");
    break;
  case OpGroupNonUniformAllEqual:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupAllEqual");
    break;
  case OpGroupNonUniformBroadcast:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupBroadcast");
    break;
  case OpGroupNonUniformBroadcastFirst:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupBroadcastFirst");
    break;
  case OpGroupNonUniformBallot:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupBallot");
    break;
  case OpGroupNonUniformInverseBallot:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupInverseBallot");
    break;
  case OpGroupNonUniformBallotBitExtract:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupBallotBitExtract")
    ;
    break;
  case OpGroupNonUniformBallotBitCount:
    local_1f0 = pSStack_20[3];
    if (local_1f0 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupBallotBitCount");
    }
    else if (local_1f0 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupBallotInclusiveBitCount");
    }
    else {
      if (local_1f0 != ScopeWorkgroup) {
        local_212 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_3,"Invalid BitCount operation.",&local_211);
        CompilerError::CompilerError(pCVar2,(string *)&operation_3);
        local_212 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupBallotExclusiveBitCount");
    }
    break;
  case OpGroupNonUniformBallotFindLSB:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupBallotFindLSB");
    break;
  case OpGroupNonUniformBallotFindMSB:
    emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupBallotFindMSB");
    break;
  case OpGroupNonUniformShuffle:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupShuffle");
    break;
  case OpGroupNonUniformShuffleXor:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupShuffleXor");
    break;
  case OpGroupNonUniformShuffleUp:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupShuffleUp");
    break;
  case OpGroupNonUniformShuffleDown:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupShuffleDown");
    break;
  case OpGroupNonUniformIAdd:
    local_2b8 = pSStack_20[3];
    if (local_2b8 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupAdd");
    }
    else if (local_2b8 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveAdd");
    }
    else if (local_2b8 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveAdd");
    }
    else {
      if (local_2b8 != ScopeSubgroup) {
        local_2da = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_8,"Invalid group operation.",&local_2d9)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_8);
        local_2da = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredAdd");
    }
    break;
  case OpGroupNonUniformFAdd:
    local_218 = pSStack_20[3];
    if (local_218 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupAdd");
    }
    else if (local_218 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveAdd");
    }
    else if (local_218 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveAdd");
    }
    else {
      if (local_218 != ScopeSubgroup) {
        local_23a = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_4,"Invalid group operation.",&local_239)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_4);
        local_23a = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredAdd");
    }
    break;
  case OpGroupNonUniformIMul:
    local_2e0 = pSStack_20[3];
    if (local_2e0 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupMul");
    }
    else if (local_2e0 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMul");
    }
    else if (local_2e0 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMul");
    }
    else {
      if (local_2e0 != ScopeSubgroup) {
        local_302 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_9,"Invalid group operation.",&local_301)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_9);
        local_302 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMul");
    }
    break;
  case OpGroupNonUniformFMul:
    local_240 = pSStack_20[3];
    if (local_240 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupMul");
    }
    else if (local_240 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMul");
    }
    else if (local_240 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMul");
    }
    else {
      if (local_240 != ScopeSubgroup) {
        local_262 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_5,"Invalid group operation.",&local_261)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_5);
        local_262 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMul");
    }
    break;
  case OpGroupNonUniformSMin:
    local_308 = pSStack_20[3];
    if (local_308 == ScopeCrossDevice) {
      emit_unary_func_op_cast(this,scope,local_19c,pSStack_20[4],"subgroupMin",operation,operation);
    }
    else if (local_308 == ScopeDevice) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMin",operation,operation);
    }
    else if (local_308 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMin",operation,operation);
    }
    else {
      if (local_308 != ScopeSubgroup) {
        local_32a = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_10,"Invalid group operation.",&local_329);
        CompilerError::CompilerError(pCVar2,(string *)&operation_10);
        local_32a = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin",operation);
    }
    break;
  case OpGroupNonUniformUMin:
    local_358 = pSStack_20[3];
    if (local_358 == ScopeCrossDevice) {
      emit_unary_func_op_cast(this,scope,local_19c,pSStack_20[4],"subgroupMin",local_6c,local_6c);
    }
    else if (local_358 == ScopeDevice) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMin",local_6c,local_6c);
    }
    else if (local_358 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMin",local_6c,local_6c);
    }
    else {
      if (local_358 != ScopeSubgroup) {
        local_37a = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_12,"Invalid group operation.",&local_379);
        CompilerError::CompilerError(pCVar2,(string *)&operation_12);
        local_37a = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin",local_6c);
    }
    break;
  case OpGroupNonUniformFMin:
    local_268 = pSStack_20[3];
    if (local_268 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupMin");
    }
    else if (local_268 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMin");
    }
    else if (local_268 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMin");
    }
    else {
      if (local_268 != ScopeSubgroup) {
        local_28a = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_6,"Invalid group operation.",&local_289)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_6);
        local_28a = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMin");
    }
    break;
  case OpGroupNonUniformSMax:
    local_330 = pSStack_20[3];
    if (local_330 == ScopeCrossDevice) {
      emit_unary_func_op_cast(this,scope,local_19c,pSStack_20[4],"subgroupMax",operation,operation);
    }
    else if (local_330 == ScopeDevice) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMax",operation,operation);
    }
    else if (local_330 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMax",operation,operation);
    }
    else {
      if (local_330 != ScopeSubgroup) {
        local_352 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_11,"Invalid group operation.",&local_351);
        CompilerError::CompilerError(pCVar2,(string *)&operation_11);
        local_352 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax",operation);
    }
    break;
  case OpGroupNonUniformUMax:
    local_380 = pSStack_20[3];
    if (local_380 == ScopeCrossDevice) {
      emit_unary_func_op_cast(this,scope,local_19c,pSStack_20[4],"subgroupMax",local_6c,local_6c);
    }
    else if (local_380 == ScopeDevice) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMax",local_6c,local_6c);
    }
    else if (local_380 == ScopeWorkgroup) {
      emit_unary_func_op_cast
                (this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMax",local_6c,local_6c);
    }
    else {
      if (local_380 != ScopeSubgroup) {
        local_3a2 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_13,"Invalid group operation.",&local_3a1);
        CompilerError::CompilerError(pCVar2,(string *)&operation_13);
        local_3a2 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op_cast_clustered
                (this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax",local_6c);
    }
    break;
  case OpGroupNonUniformFMax:
    local_290 = pSStack_20[3];
    if (local_290 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupMax");
    }
    else if (local_290 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveMax");
    }
    else if (local_290 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveMax");
    }
    else {
      if (local_290 != ScopeSubgroup) {
        local_2b2 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_7,"Invalid group operation.",&local_2b1)
        ;
        CompilerError::CompilerError(pCVar2,(string *)&operation_7);
        local_2b2 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredMax");
    }
    break;
  case OpGroupNonUniformBitwiseAnd:
    local_3a8 = pSStack_20[3];
    if (local_3a8 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupAnd");
    }
    else if (local_3a8 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveAnd");
    }
    else if (local_3a8 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveAnd");
    }
    else {
      if (local_3a8 != ScopeSubgroup) {
        local_3ca = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_14,"Invalid group operation.",&local_3c9);
        CompilerError::CompilerError(pCVar2,(string *)&operation_14);
        local_3ca = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredAnd");
    }
    break;
  case OpGroupNonUniformBitwiseOr:
    local_3d0 = pSStack_20[3];
    if (local_3d0 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupOr");
    }
    else if (local_3d0 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveOr");
    }
    else if (local_3d0 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveOr");
    }
    else {
      if (local_3d0 != ScopeSubgroup) {
        local_3f2 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_15,"Invalid group operation.",&local_3f1);
        CompilerError::CompilerError(pCVar2,(string *)&operation_15);
        local_3f2 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredOr");
    }
    break;
  case OpGroupNonUniformBitwiseXor:
    local_3f8 = pSStack_20[3];
    if (local_3f8 == ScopeCrossDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupXor");
    }
    else if (local_3f8 == ScopeDevice) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupInclusiveXor");
    }
    else if (local_3f8 == ScopeWorkgroup) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[4],"subgroupExclusiveXor");
    }
    else {
      if (local_3f8 != ScopeSubgroup) {
        local_41a = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&direction,"Invalid group operation.",&local_419);
        CompilerError::CompilerError(pCVar2,(string *)&direction);
        local_41a = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_binary_func_op(this,scope,local_19c,pSStack_20[4],pSStack_20[5],"subgroupClusteredXor");
    }
    break;
  default:
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_468,"Invalid opcode for subgroup.",&local_469);
    CompilerError::CompilerError(pCVar2,(string *)local_468);
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case OpGroupNonUniformQuadBroadcast:
    emit_binary_func_op(this,scope,local_19c,pSStack_20[3],pSStack_20[4],"subgroupQuadBroadcast");
    break;
  case OpGroupNonUniformQuadSwap:
    local_420 = Compiler::evaluate_constant_u32(&this->super_Compiler,pSStack_20[4]);
    if (local_420 == 0) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupQuadSwapHorizontal");
    }
    else if (local_420 == 1) {
      emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupQuadSwapVertical");
    }
    else {
      if (local_420 != 2) {
        local_442 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_440,"Invalid quad swap direction.",&local_441);
        CompilerError::CompilerError(pCVar2,(string *)local_440);
        local_442 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      emit_unary_func_op(this,scope,local_19c,pSStack_20[3],"subgroupQuadSwapDiagonal");
    }
  }
  register_control_dependent_expression(this,local_19c);
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBrodcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	case OpGroupNonUniformFAdd:
	case OpGroupNonUniformFMul:
	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformIAdd:
	case OpGroupNonUniformIMul:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}